

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBCopyAlphaRow_AVX2(uint8_t *src,uint8_t *dst,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [32];
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 in_ZMM0 [64];
  
  auVar6 = vpcmpeqb_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar6 = vpsrld_avx2(auVar6,8);
  do {
    auVar2 = *(undefined1 (*) [32])src;
    pauVar1 = (undefined1 (*) [32])((long)src + 0x20);
    src = (uint8_t *)((long)src + 0x40);
    auVar2 = vpblendvb_avx2(auVar2,*(undefined1 (*) [32])dst,auVar6);
    auVar4 = vpblendvb_avx2(*pauVar1,*(undefined1 (*) [32])((long)dst + 0x20),auVar6);
    *(undefined1 (*) [32])dst = auVar2;
    *(undefined1 (*) [32])((long)dst + 0x20) = auVar4;
    dst = (uint8_t *)((long)dst + 0x40);
    iVar5 = width + -0x10;
    bVar3 = 0xf < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar3);
  return;
}

Assistant:

void ARGBCopyAlphaRow_AVX2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "vpcmpeqb    %%ymm0,%%ymm0,%%ymm0          \n"
      "vpsrld      $0x8,%%ymm0,%%ymm0            \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm1                   \n"
      "vmovdqu     0x20(%0),%%ymm2               \n"
      "lea         0x40(%0),%0                   \n"
      "vpblendvb   %%ymm0,(%1),%%ymm1,%%ymm1     \n"
      "vpblendvb   %%ymm0,0x20(%1),%%ymm2,%%ymm2 \n"
      "vmovdqu     %%ymm1,(%1)                   \n"
      "vmovdqu     %%ymm2,0x20(%1)               \n"
      "lea         0x40(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}